

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecjpake.c
# Opt level: O2

int ecjpake_kkp_read(mbedtls_md_type_t md_type,mbedtls_ecp_group *grp,int pf,mbedtls_ecp_point *G,
                    mbedtls_ecp_point *X,char *id,uchar **p,uchar *end)

{
  byte *buf;
  byte *pbVar1;
  int iVar2;
  int iVar3;
  ulong buflen;
  undefined1 local_c8 [8];
  mbedtls_ecp_point VV;
  mbedtls_ecp_point V;
  mbedtls_mpi r;
  
  iVar2 = -0x4f80;
  if ((*p <= end) && (iVar2 = mbedtls_ecp_tls_read_point(grp,X,p,(long)end - (long)*p), iVar2 == 0))
  {
    iVar3 = mbedtls_ecp_is_zero(X);
    iVar2 = -0x4c80;
    if (iVar3 == 0) {
      mbedtls_ecp_point_init((mbedtls_ecp_point *)&VV.Z.s);
      mbedtls_ecp_point_init((mbedtls_ecp_point *)local_c8);
      mbedtls_mpi_init((mbedtls_mpi *)&V.Z.s);
      mbedtls_mpi_init((mbedtls_mpi *)&r.s);
      iVar2 = -0x4f80;
      if (*p <= end) {
        iVar3 = mbedtls_ecp_tls_read_point(grp,(mbedtls_ecp_point *)&VV.Z.s,p,(long)end - (long)*p);
        if ((iVar3 == 0) && (pbVar1 = *p, iVar3 = iVar2, pbVar1 < end)) {
          buf = pbVar1 + 1;
          *p = buf;
          buflen = (ulong)*pbVar1;
          if ((buflen <= (ulong)((long)end - (long)buf) && buflen != 0) &&
             (iVar3 = mbedtls_mpi_read_binary((mbedtls_mpi *)&V.Z.s,buf,buflen), iVar3 == 0)) {
            *p = *p + buflen;
            iVar3 = ecjpake_hash(md_type,grp,pf,G,(mbedtls_ecp_point *)&VV.Z.s,X,id,
                                 (mbedtls_mpi *)&r.s);
            if ((iVar3 == 0) &&
               (iVar3 = mbedtls_ecp_muladd(grp,(mbedtls_ecp_point *)local_c8,(mbedtls_mpi *)&r.s,X,
                                           (mbedtls_mpi *)&V.Z.s,G), iVar3 == 0)) {
              iVar2 = mbedtls_ecp_point_cmp
                                ((mbedtls_ecp_point *)local_c8,(mbedtls_ecp_point *)&VV.Z.s);
              iVar3 = -0x4e00;
              if (iVar2 == 0) {
                iVar3 = 0;
              }
            }
          }
        }
        iVar2 = iVar3;
        mbedtls_ecp_point_free((mbedtls_ecp_point *)&VV.Z.s);
        mbedtls_ecp_point_free((mbedtls_ecp_point *)local_c8);
        mbedtls_mpi_free((mbedtls_mpi *)&V.Z.s);
        mbedtls_mpi_free((mbedtls_mpi *)&r.s);
      }
    }
  }
  return iVar2;
}

Assistant:

static int ecjpake_kkp_read(const mbedtls_md_type_t md_type,
                            const mbedtls_ecp_group *grp,
                            const int pf,
                            const mbedtls_ecp_point *G,
                            mbedtls_ecp_point *X,
                            const char *id,
                            const unsigned char **p,
                            const unsigned char *end)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;

    if (end < *p) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    /*
     * struct {
     *     ECPoint X;
     *     ECSchnorrZKP zkp;
     * } ECJPAKEKeyKP;
     */
    MBEDTLS_MPI_CHK(mbedtls_ecp_tls_read_point(grp, X, p, end - *p));
    if (mbedtls_ecp_is_zero(X)) {
        ret = MBEDTLS_ERR_ECP_INVALID_KEY;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(ecjpake_zkp_read(md_type, grp, pf, G, X, id, p, end));

cleanup:
    return ret;
}